

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::TestVideoParam,_int>_>
* __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::TestVideoParam,_int>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_>::Clone
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this)

{
  ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::TestVideoParam,_int>_>
  *pPVar1;
  
  pPVar1 = (ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::TestVideoParam,_int>_>
            *)operator_new(0x80);
  pPVar1->_vptr_ParamIteratorInterface = (_func_int **)&PTR__IteratorImpl_00f4d868;
  pPVar1[1]._vptr_ParamIteratorInterface = (_func_int **)this->base_;
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<int>_>
  ::tuple((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<int>_>
           *)(pPVar1 + 2),&this->begin_);
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<int>_>
  ::tuple((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<int>_>
           *)(pPVar1 + 6),&this->end_);
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<int>_>
  ::tuple((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<int>_>
           *)(pPVar1 + 10),&this->current_);
  pPVar1[0xe]._vptr_ParamIteratorInterface =
       (_func_int **)
       (this->current_value_).
       super___shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::TestVideoParam,_int>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(pPVar1 + 0xf),
             &(this->current_value_).
              super___shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::TestVideoParam,_int>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return pPVar1;
}

Assistant:

ParamIteratorInterface<ParamType>* Clone() const override {
      return new IteratorImpl(*this);
    }